

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
argument_loader<std::vector<std::vector<NodePosition,std::allocator<NodePosition>>,std::allocator<std::vector<NodePosition,std::allocator<NodePosition>>>>&,std::vector<NodePosition,std::allocator<NodePosition>>const&>
::load_impl_sequence<0ul,1ul>
          (argument_loader<std::vector<std::vector<NodePosition,std::allocator<NodePosition>>,std::allocator<std::vector<NodePosition,std::allocator<NodePosition>>>>&,std::vector<NodePosition,std::allocator<NodePosition>>const&>
           *this,long call)

{
  handle hVar1;
  bool bVar2;
  bool bVar3;
  reference rVar4;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x18),hVar1,(*rVar4._M_p & rVar4._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),1);
  bVar3 = list_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_NodePosition>::load
                    ((list_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_NodePosition>
                      *)this,hVar1,(*rVar4._M_p & rVar4._M_mask) != 0);
  return bVar3 && bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }